

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O3

node_pointer __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<int_const,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,int,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::hash<int>,std::equal_to<int>>>
::find_node_impl<int,std::equal_to<int>>
          (table<boost::unordered::detail::map<std::allocator<std::pair<int_const,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>>,int,boost::tuples::tuple<bool,unsigned_int,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>,boost::hash<int>,std::equal_to<int>>>
           *this,size_t key_hash,int *k,equal_to<int> *eq)

{
  type tVar1;
  ulong uVar2;
  node_pointer ppVar3;
  node_pointer n2;
  node_pointer ppVar4;
  
  ppVar4 = (node_pointer)0x0;
  uVar2 = *(ulong *)(this + 8);
  ppVar3 = table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
           ::begin((table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
                    *)this,key_hash % uVar2);
  if (ppVar3 != (node_pointer)0x0) {
    tVar1 = (ppVar3->value_base_).data_.data_.align_;
    ppVar4 = ppVar3;
    while ((type)*k != tVar1) {
      if ((ppVar4->bucket_info_ & 0x7fffffffffffffff) != key_hash % uVar2) {
        return (node_pointer)0x0;
      }
      do {
        ppVar4 = (node_pointer)(ppVar4->super_ptr_bucket).next_;
        if (ppVar4 == (node_pointer)0x0) {
          return (node_pointer)0x0;
        }
      } while ((long)ppVar4->bucket_info_ < 0);
      tVar1 = (ppVar4->value_base_).data_.data_.align_;
    }
  }
  return ppVar4;
}

Assistant:

node_pointer find_node_impl(
          std::size_t key_hash, Key const& k, Pred const& eq) const
        {
          std::size_t bucket_index = this->hash_to_bucket(key_hash);
          node_pointer n = this->begin(bucket_index);

          for (;;) {
            if (!n)
              return n;

            if (eq(k, this->get_key(n))) {
              return n;
            } else if (this->node_bucket(n) != bucket_index) {
              return node_pointer();
            }

            n = next_for_find(n);
          }
        }